

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_parser_t * mpc_checkf(mpc_parser_t *a,mpc_dtor_t da,mpc_check_t f,char *fmt,...)

{
  char in_AL;
  char *__s;
  mpc_parser_t *pmVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_f8 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &va[0].overflow_arg_area;
  local_108 = 0x3000000020;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __s = (char *)malloc(0x800);
  vsprintf(__s,fmt,&local_108);
  pmVar1 = mpc_check(a,da,f,__s);
  free(__s);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_checkf(mpc_parser_t *a, mpc_dtor_t da, mpc_check_t f, const char *fmt, ...) {
  va_list va;
  char *buffer;
  mpc_parser_t *p;

  va_start(va, fmt);
  buffer = malloc(2048);
  vsprintf(buffer, fmt, va);
  va_end(va);

  p = mpc_check(a, da, f, buffer);
  free(buffer);

  return p;
}